

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

bool __thiscall DynamicHistogram<double>::merge(DynamicHistogram<double> *this)

{
  FixedSizeCache<double> *this_00;
  pointer pdVar1;
  pointer pdVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_type __n;
  ulong uVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  value_type_conflict2 local_20;
  
  cVar3 = this->_initialized;
  if ((this->_cache)._count != 0) {
    this_00 = &this->_cache;
    if ((bool)cVar3 == false) {
      dVar13 = FixedSizeCache<double>::max(this_00);
      this->_binMax = dVar13;
      dVar13 = FixedSizeCache<double>::min(this_00);
      this->_binMin = dVar13;
      this->_binWidth = (this->_binMax - dVar13) / (double)this->_binCount;
      if (0 < (this->_cache)._count) {
        iVar4 = 0;
        do {
          dVar13 = FixedSizeCache<double>::at(this_00,iVar4);
          add_(this,dVar13);
          iVar4 = iVar4 + 1;
        } while (iVar4 < (this->_cache)._count);
      }
      local_20 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&(this->_cache)._data,
                 (long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,&local_20);
      (this->_cache)._count = 0;
      this->_initialized = true;
    }
    else {
      this->_numMerges = this->_numMerges + 1;
      dVar13 = FixedSizeCache<double>::min(this_00);
      if ((this->_binMax != dVar13) || (NAN(this->_binMax) || NAN(dVar13))) {
        dVar14 = this->_binMin;
        dVar15 = this->_binWidth;
        dVar13 = floor((dVar13 - dVar14) / dVar15);
        iVar4 = (int)dVar13;
      }
      else {
        iVar4 = this->_binCount + -1;
        dVar14 = this->_binMin;
        dVar15 = this->_binWidth;
      }
      FixedSizeCache<double>::min(this_00);
      dVar13 = this->_binWidth * -0.5 + ((double)iVar4 + 0.5) * dVar15 + dVar14;
      dVar14 = FixedSizeCache<double>::max(this_00);
      if ((this->_binMax != dVar14) || (NAN(this->_binMax) || NAN(dVar14))) {
        dVar15 = this->_binMin;
        dVar17 = this->_binWidth;
        dVar14 = floor((dVar14 - dVar15) / dVar17);
        iVar4 = (int)dVar14;
      }
      else {
        iVar4 = this->_binCount + -1;
        dVar15 = this->_binMin;
        dVar17 = this->_binWidth;
      }
      FixedSizeCache<double>::max(this_00);
      dVar14 = this->_binWidth;
      dVar16 = dVar14 * 0.5 + ((double)iVar4 + 0.5) * dVar17 + dVar15;
      dVar15 = this->_binMax;
      dVar17 = this->_binMin;
      dVar18 = dVar15;
      if (dVar15 <= dVar16) {
        dVar18 = dVar16;
      }
      dVar16 = dVar17;
      if (dVar13 <= dVar17) {
        dVar16 = dVar13;
      }
      dVar13 = ceil((dVar18 - dVar16) / (dVar15 - dVar17));
      iVar4 = this->_binCount;
      dVar13 = (double)((int)dVar13 * iVar4) * dVar14;
      dVar16 = dVar16 - (double)((int)(((dVar13 + dVar16) - dVar18) / dVar14) / 2) * dVar14;
      dVar13 = dVar13 + dVar16;
      dVar14 = (dVar13 - dVar16) / (double)iVar4;
      if ((long)iVar4 < 1) {
        pdVar12 = (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar11 = (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar9 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar10 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        __n = (long)pdVar10 - (long)pdVar9 >> 3;
      }
      else {
        pdVar9 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar10 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        __n = (long)pdVar10 - (long)pdVar9 >> 3;
        pdVar11 = (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pdVar12 = (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar6 = (long)pdVar11 - (long)pdVar12 >> 3;
        uVar8 = 0;
        do {
          uVar7 = __n;
          uVar5 = __n;
          if ((__n == uVar8) ||
             (uVar5 = (ulong)(int)(((((double)(int)uVar8 + 0.5) * this->_binWidth + this->_binMin) -
                                   dVar16) / dVar14), uVar7 = uVar6, uVar6 <= uVar5)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar5,uVar7);
          }
          pdVar12[uVar5] = pdVar9[uVar8] + pdVar12[uVar5];
          uVar8 = uVar8 + 1;
        } while ((long)iVar4 != uVar8);
      }
      pdVar1 = (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar2 = (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = pdVar9;
      (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar10;
      (this->_temp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar1;
      (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = pdVar12;
      (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdVar11;
      (this->_frequencies).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar2;
      local_20 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign(&this->_temp,__n,&local_20);
      this->_binMax = dVar13;
      this->_binMin = dVar16;
      this->_binWidth = dVar14;
      if (0 < (this->_cache)._count) {
        iVar4 = 0;
        do {
          dVar13 = FixedSizeCache<double>::at(this_00,iVar4);
          add_(this,dVar13);
          iVar4 = iVar4 + 1;
        } while (iVar4 < (this->_cache)._count);
      }
      local_20 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&(this->_cache)._data,
                 (long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_cache)._data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,&local_20);
      (this->_cache)._count = 0;
    }
    cVar3 = '\x01';
  }
  return (bool)cVar3;
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }